

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

PmError Pm_SetOverflow(PmQueue *q)

{
  long tail;
  PmQueueRep *queue;
  PmQueue *q_local;
  
  if (q == (PmQueue *)0x0) {
    q_local._4_4_ = pmBadPtr;
  }
  else if (*(long *)((long)q + 0x18) == 0) {
    *(long *)((long)q + 0x18) = *(long *)((long)q + 8) + 1;
    q_local._4_4_ = pmBufferOverflow;
  }
  else {
    q_local._4_4_ = pmBufferOverflow;
  }
  return q_local._4_4_;
}

Assistant:

PMEXPORT PmError Pm_SetOverflow(PmQueue *q)
{
    PmQueueRep *queue = (PmQueueRep *) q;
    long tail;
    /* arg checking */
    if (!queue)
        return pmBadPtr;
    /* no more enqueue until receiver acknowledges overflow */
    if (queue->overflow) return pmBufferOverflow;
    tail = queue->tail;
    queue->overflow = tail + 1;
    return pmBufferOverflow;
}